

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int whereLoopAddVirtualOne
              (WhereLoopBuilder *pBuilder,Bitmask mPrereq,Bitmask mUsable,u16 mExclude,
              sqlite3_index_info *pIdxInfo,u16 mNoOmit,int *pbIn)

{
  u16 *puVar1;
  double dVar2;
  byte bVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  WhereClause *pWVar7;
  sqlite3_index_constraint_usage *__s;
  WhereLoop *pTemplate;
  Parse *pParse;
  SrcList *pSVar8;
  WhereTerm *pWVar9;
  sqlite3_vtab *psVar10;
  i8 iVar11;
  LogEst LVar12;
  int iVar13;
  VTable *pVVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  uchar *puVar18;
  uint uVar19;
  uint uVar20;
  bool bVar21;
  
  pWVar7 = pBuilder->pWC;
  __s = pIdxInfo->aConstraintUsage;
  pTemplate = pBuilder->pNew;
  pParse = pBuilder->pWInfo->pParse;
  pSVar8 = pBuilder->pWInfo->pTabList;
  bVar3 = pTemplate->iTab;
  uVar4 = pIdxInfo->nConstraint;
  *pbIn = 0;
  pTemplate->prereq = mPrereq;
  uVar20 = 0;
  if (0 < (int)uVar4) {
    uVar20 = uVar4;
  }
  puVar18 = &pIdxInfo->aConstraint->usable;
  uVar19 = uVar20;
  while (bVar21 = uVar19 != 0, uVar19 = uVar19 - 1, bVar21) {
    pWVar9 = pWVar7->a;
    *puVar18 = '\0';
    if (((pWVar9[*(int *)(puVar18 + 3)].prereqRight & ~mUsable) == 0) &&
       ((pWVar9[*(int *)(puVar18 + 3)].eOperator & mExclude) == 0)) {
      *puVar18 = '\x01';
    }
    puVar18 = puVar18 + 0xc;
  }
  memset(__s,0,(long)(int)uVar4 * 8);
  pIdxInfo->idxStr = (char *)0x0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = 5e+98;
  pIdxInfo->estimatedRows = 0x19;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = pSVar8->a[bVar3].colUsed;
  pVVar14 = sqlite3GetVTable(pParse->db,pSVar8->a[bVar3].pTab);
  psVar10 = pVVar14->pVtab;
  iVar13 = (*psVar10->pModule->xBestIndex)(psVar10,pIdxInfo);
  if (iVar13 != 0) {
    if (iVar13 == 7) {
      sqlite3OomFault(pParse->db);
    }
    else {
      pcVar15 = psVar10->zErrMsg;
      if (pcVar15 == (char *)0x0) {
        pcVar15 = sqlite3ErrStr(iVar13);
      }
      sqlite3ErrorMsg(pParse,"%s",pcVar15);
    }
  }
  sqlite3_free(psVar10->zErrMsg);
  psVar10->zErrMsg = (char *)0x0;
  iVar13 = pParse->nErr;
  if (iVar13 == 0) {
    for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
      pTemplate->aLTerm[uVar17] = (WhereTerm *)0x0;
    }
    (pTemplate->u).btree.nIdxCol = 0;
    puVar18 = &pIdxInfo->aConstraint->usable;
    uVar19 = 0xffffffff;
    for (uVar17 = 0; uVar20 != uVar17; uVar17 = uVar17 + 1) {
      uVar5 = __s[uVar17].argvIndex;
      if (0 < (int)uVar5) {
        if ((int)uVar4 < (int)uVar5) {
LAB_00166af8:
          sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",(pSVar8->a[bVar3].pTab)->zName);
          return 1;
        }
        uVar6 = *(uint *)(puVar18 + 3);
        if (((int)uVar6 < 0) || (pWVar7->nTerm <= (int)uVar6)) goto LAB_00166af8;
        uVar16 = uVar5 - 1;
        if ((pTemplate->aLTerm[uVar16] != (WhereTerm *)0x0) || (*puVar18 == '\0'))
        goto LAB_00166af8;
        pWVar9 = pWVar7->a + uVar6;
        pTemplate->prereq = pTemplate->prereq | pWVar7->a[uVar6].prereqRight;
        pTemplate->aLTerm[uVar16] = pWVar9;
        if ((int)uVar19 < (int)uVar16) {
          uVar19 = uVar16;
        }
        if ((uVar5 < 0x11) && (__s[uVar17].omit != '\0')) {
          puVar1 = &(pTemplate->u).btree.nIdxCol;
          *puVar1 = *puVar1 | (ushort)(1 << ((byte)uVar16 & 0x1f));
        }
        if ((pWVar9->eOperator & 1) != 0) {
          pIdxInfo->orderByConsumed = 0;
          *(byte *)&pIdxInfo->idxFlags = (byte)pIdxInfo->idxFlags & 0xfe;
          *pbIn = 1;
        }
      }
      puVar18 = puVar18 + 0xc;
    }
    puVar1 = &(pTemplate->u).btree.nIdxCol;
    *puVar1 = *puVar1 & ~mNoOmit;
    pTemplate->nLTerm = (short)uVar19 + 1;
    (pTemplate->u).vtab.idxNum = pIdxInfo->idxNum;
    (pTemplate->u).vtab.needFree = (u8)pIdxInfo->needToFreeIdxStr;
    pIdxInfo->needToFreeIdxStr = 0;
    (pTemplate->u).btree.pIndex = (Index *)pIdxInfo->idxStr;
    if (pIdxInfo->orderByConsumed == 0) {
      iVar11 = '\0';
    }
    else {
      iVar11 = (i8)pIdxInfo->nOrderBy;
    }
    (pTemplate->u).vtab.isOrdered = iVar11;
    pTemplate->rSetup = 0;
    dVar2 = pIdxInfo->estimatedCost;
    if (dVar2 <= 1.0) {
      LVar12 = 0;
    }
    else if (dVar2 <= 2000000000.0) {
      LVar12 = sqlite3LogEst((long)(dVar2 - 9.223372036854776e+18) & (long)dVar2 >> 0x3f |
                             (long)dVar2);
    }
    else {
      LVar12 = (ushort)((ulong)dVar2 >> 0x34) * 10 + -0x27ec;
    }
    pTemplate->rRun = LVar12;
    LVar12 = sqlite3LogEst(pIdxInfo->estimatedRows);
    pTemplate->nOut = LVar12;
    pTemplate->wsFlags = (pIdxInfo->idxFlags & 1U) << 0xc | pTemplate->wsFlags & 0xffffefff;
    iVar13 = whereLoopInsert(pBuilder,pTemplate);
    if ((pTemplate->u).vtab.needFree != '\0') {
      sqlite3_free((pTemplate->u).btree.pIndex);
      (pTemplate->u).vtab.needFree = '\0';
    }
  }
  return iVar13;
}

Assistant:

static int whereLoopAddVirtualOne(
  WhereLoopBuilder *pBuilder,
  Bitmask mPrereq,                /* Mask of tables that must be used. */
  Bitmask mUsable,                /* Mask of usable tables */
  u16 mExclude,                   /* Exclude terms using these operators */
  sqlite3_index_info *pIdxInfo,   /* Populated object for xBestIndex */
  u16 mNoOmit,                    /* Do not omit these constraints */
  int *pbIn                       /* OUT: True if plan uses an IN(...) op */
){
  WhereClause *pWC = pBuilder->pWC;
  struct sqlite3_index_constraint *pIdxCons;
  struct sqlite3_index_constraint_usage *pUsage = pIdxInfo->aConstraintUsage;
  int i;
  int mxTerm;
  int rc = SQLITE_OK;
  WhereLoop *pNew = pBuilder->pNew;
  Parse *pParse = pBuilder->pWInfo->pParse;
  struct SrcList_item *pSrc = &pBuilder->pWInfo->pTabList->a[pNew->iTab];
  int nConstraint = pIdxInfo->nConstraint;

  assert( (mUsable & mPrereq)==mPrereq );
  *pbIn = 0;
  pNew->prereq = mPrereq;

  /* Set the usable flag on the subset of constraints identified by 
  ** arguments mUsable and mExclude. */
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    WhereTerm *pTerm = &pWC->a[pIdxCons->iTermOffset];
    pIdxCons->usable = 0;
    if( (pTerm->prereqRight & mUsable)==pTerm->prereqRight 
     && (pTerm->eOperator & mExclude)==0
    ){
      pIdxCons->usable = 1;
    }
  }

  /* Initialize the output fields of the sqlite3_index_info structure */
  memset(pUsage, 0, sizeof(pUsage[0])*nConstraint);
  assert( pIdxInfo->needToFreeIdxStr==0 );
  pIdxInfo->idxStr = 0;
  pIdxInfo->idxNum = 0;
  pIdxInfo->orderByConsumed = 0;
  pIdxInfo->estimatedCost = SQLITE_BIG_DBL / (double)2;
  pIdxInfo->estimatedRows = 25;
  pIdxInfo->idxFlags = 0;
  pIdxInfo->colUsed = (sqlite3_int64)pSrc->colUsed;

  /* Invoke the virtual table xBestIndex() method */
  rc = vtabBestIndex(pParse, pSrc->pTab, pIdxInfo);
  if( rc ) return rc;

  mxTerm = -1;
  assert( pNew->nLSlot>=nConstraint );
  for(i=0; i<nConstraint; i++) pNew->aLTerm[i] = 0;
  pNew->u.vtab.omitMask = 0;
  pIdxCons = *(struct sqlite3_index_constraint**)&pIdxInfo->aConstraint;
  for(i=0; i<nConstraint; i++, pIdxCons++){
    int iTerm;
    if( (iTerm = pUsage[i].argvIndex - 1)>=0 ){
      WhereTerm *pTerm;
      int j = pIdxCons->iTermOffset;
      if( iTerm>=nConstraint
       || j<0
       || j>=pWC->nTerm
       || pNew->aLTerm[iTerm]!=0
       || pIdxCons->usable==0
      ){
        rc = SQLITE_ERROR;
        sqlite3ErrorMsg(pParse,"%s.xBestIndex malfunction",pSrc->pTab->zName);
        return rc;
      }
      testcase( iTerm==nConstraint-1 );
      testcase( j==0 );
      testcase( j==pWC->nTerm-1 );
      pTerm = &pWC->a[j];
      pNew->prereq |= pTerm->prereqRight;
      assert( iTerm<pNew->nLSlot );
      pNew->aLTerm[iTerm] = pTerm;
      if( iTerm>mxTerm ) mxTerm = iTerm;
      testcase( iTerm==15 );
      testcase( iTerm==16 );
      if( iTerm<16 && pUsage[i].omit ) pNew->u.vtab.omitMask |= 1<<iTerm;
      if( (pTerm->eOperator & WO_IN)!=0 ){
        /* A virtual table that is constrained by an IN clause may not
        ** consume the ORDER BY clause because (1) the order of IN terms
        ** is not necessarily related to the order of output terms and
        ** (2) Multiple outputs from a single IN value will not merge
        ** together.  */
        pIdxInfo->orderByConsumed = 0;
        pIdxInfo->idxFlags &= ~SQLITE_INDEX_SCAN_UNIQUE;
        *pbIn = 1; assert( (mExclude & WO_IN)==0 );
      }
    }
  }
  pNew->u.vtab.omitMask &= ~mNoOmit;

  pNew->nLTerm = mxTerm+1;
  assert( pNew->nLTerm<=pNew->nLSlot );
  pNew->u.vtab.idxNum = pIdxInfo->idxNum;
  pNew->u.vtab.needFree = pIdxInfo->needToFreeIdxStr;
  pIdxInfo->needToFreeIdxStr = 0;
  pNew->u.vtab.idxStr = pIdxInfo->idxStr;
  pNew->u.vtab.isOrdered = (i8)(pIdxInfo->orderByConsumed ?
      pIdxInfo->nOrderBy : 0);
  pNew->rSetup = 0;
  pNew->rRun = sqlite3LogEstFromDouble(pIdxInfo->estimatedCost);
  pNew->nOut = sqlite3LogEst(pIdxInfo->estimatedRows);

  /* Set the WHERE_ONEROW flag if the xBestIndex() method indicated
  ** that the scan will visit at most one row. Clear it otherwise. */
  if( pIdxInfo->idxFlags & SQLITE_INDEX_SCAN_UNIQUE ){
    pNew->wsFlags |= WHERE_ONEROW;
  }else{
    pNew->wsFlags &= ~WHERE_ONEROW;
  }
  rc = whereLoopInsert(pBuilder, pNew);
  if( pNew->u.vtab.needFree ){
    sqlite3_free(pNew->u.vtab.idxStr);
    pNew->u.vtab.needFree = 0;
  }
  WHERETRACE(0xffff, ("  bIn=%d prereqIn=%04llx prereqOut=%04llx\n",
                      *pbIn, (sqlite3_uint64)mPrereq,
                      (sqlite3_uint64)(pNew->prereq & ~mPrereq)));

  return rc;
}